

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TreePushOverrideID(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *__src;
  uint *__dest;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  Indent(0.0);
  piVar1 = &(pIVar3->DC).TreeDepth;
  *piVar1 = *piVar1 + 1;
  iVar5 = (pIVar3->IDStack).Size;
  iVar2 = (pIVar3->IDStack).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (uint *)MemAlloc((long)iVar5 << 2);
      __src = (pIVar3->IDStack).Data;
      if (__src != (uint *)0x0) {
        memcpy(__dest,__src,(long)(pIVar3->IDStack).Size << 2);
        MemFree((pIVar3->IDStack).Data);
      }
      (pIVar3->IDStack).Data = __dest;
      (pIVar3->IDStack).Capacity = iVar5;
    }
  }
  (pIVar3->IDStack).Data[(pIVar3->IDStack).Size] = id;
  (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::TreePushOverrideID(ImGuiID id)
{
    ImGuiWindow* window = GetCurrentWindow();
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}